

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_utils.h
# Opt level: O0

void transpose(uint8_t *src,ptrdiff_t pitchSrc,uint8_t *dst,ptrdiff_t pitchDst,int width,int height)

{
  int in_R8D;
  int in_R9D;
  int i;
  int j;
  ptrdiff_t in_stack_000001d8;
  uint8_t *in_stack_000001e0;
  ptrdiff_t in_stack_000001e8;
  uint8_t *in_stack_000001f0;
  undefined4 local_30;
  undefined4 local_2c;
  
  for (local_2c = 0; local_2c < in_R9D; local_2c = local_2c + 0x10) {
    for (local_30 = 0; local_30 < in_R8D; local_30 = local_30 + 0x10) {
      transpose_TX_16X16(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,in_stack_000001d8);
    }
  }
  return;
}

Assistant:

static void transpose(const uint8_t *src, ptrdiff_t pitchSrc, uint8_t *dst,
                      ptrdiff_t pitchDst, int width, int height) {
  for (int j = 0; j < height; j += 16)
    for (int i = 0; i < width; i += 16)
      transpose_TX_16X16(src + i * pitchSrc + j, pitchSrc,
                         dst + j * pitchDst + i, pitchDst);
}